

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O3

bool woff2::WriteFont(Font *font,size_t *offset,uint8_t *dst,size_t dst_size)

{
  uint32_t uVar1;
  size_t sVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  ushort uVar5;
  ushort uVar6;
  short sVar7;
  _Rb_tree_header *p_Var8;
  
  bVar3 = false;
  sVar7 = 0;
  if (((ulong)font->num_tables << 4 | 0xc) <= dst_size) {
    uVar1 = font->flavor;
    sVar2 = *offset;
    *offset = sVar2 + 1;
    dst[sVar2] = (uint8_t)(uVar1 >> 0x18);
    sVar2 = *offset;
    *offset = sVar2 + 1;
    dst[sVar2] = (uint8_t)(uVar1 >> 0x10);
    sVar2 = *offset;
    *offset = sVar2 + 1;
    dst[sVar2] = (uint8_t)(uVar1 >> 8);
    sVar2 = *offset;
    *offset = sVar2 + 1;
    dst[sVar2] = (uint8_t)uVar1;
    sVar2 = *offset;
    *(uint16_t *)(dst + sVar2) = font->num_tables << 8 | font->num_tables >> 8;
    uVar6 = font->num_tables;
    if (uVar6 == 0) {
      uVar5 = 0;
      uVar6 = 0;
    }
    else {
      uVar5 = 0xf;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      sVar7 = uVar6 << 4;
      uVar6 = (ushort)(0x10 << ((byte)uVar5 & 0x1f));
      if (uVar5 == 0) {
        uVar6 = 0;
      }
    }
    *(ushort *)(dst + sVar2 + 2) = uVar6 << 8 | uVar6 >> 8;
    *(ushort *)(dst + sVar2 + 4) = uVar5 << 8 | uVar5 >> 8;
    *(ushort *)(dst + sVar2 + 6) = (sVar7 - uVar6 & 0xfff0) << 8 | (ushort)(sVar7 - uVar6) >> 8;
    *offset = sVar2 + 8;
    p_Var4 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 == p_Var8) {
      bVar3 = true;
    }
    else {
      do {
        bVar3 = WriteTable((Table *)&p_Var4[1]._M_parent,offset,dst,dst_size);
        if (!bVar3) {
          return bVar3;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var8);
    }
  }
  return bVar3;
}

Assistant:

bool WriteFont(const Font& font, size_t* offset, uint8_t* dst,
               size_t dst_size) {
  if (dst_size < 12ULL + 16ULL * font.num_tables) {
    return FONT_COMPRESSION_FAILURE();
  }
  StoreU32(font.flavor, offset, dst);
  Store16(font.num_tables, offset, dst);
  uint16_t max_pow2 = font.num_tables ? Log2Floor(font.num_tables) : 0;
  uint16_t search_range = max_pow2 ? 1 << (max_pow2 + 4) : 0;
  uint16_t range_shift = (font.num_tables << 4) - search_range;
  Store16(search_range, offset, dst);
  Store16(max_pow2, offset, dst);
  Store16(range_shift, offset, dst);

  for (const auto& i : font.tables) {
    if (!WriteTable(i.second, offset, dst, dst_size)) {
      return false;
    }
  }

  return true;
}